

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void __thiscall
Diffusion::diffuse_scalar
          (Diffusion *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_old,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *S_new,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *Rho_new,int S_comp,
          int nComp,int Rho_comp,Real prev_time,Real curr_time,Real be_cn_theta,MultiFab *rho_half,
          int rho_flag,MultiFab **fluxn,MultiFab **fluxnp1,int fluxComp,MultiFab *delta_rhs,
          int rhsComp,MultiFab *alpha_in,int alpha_in_comp,MultiFab **betan,MultiFab **betanp1,
          int betaComp,IntVect *cratio,BCRec *bc,Geometry *geom,bool add_old_time_divFlux,
          Vector<int,_std::allocator<int>_> *a_is_diffusive)

{
  initializer_list<amrex::Geometry> iVar1;
  initializer_list<amrex::BoxArray> iVar2;
  initializer_list<amrex::DistributionMapping> iVar3;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> iVar4;
  initializer_list<amrex::Geometry> iVar5;
  initializer_list<amrex::BoxArray> iVar6;
  initializer_list<amrex::DistributionMapping> iVar7;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> iVar8;
  initializer_list<amrex::MultiFab_*> iVar9;
  initializer_list<amrex::MultiFab_*> iVar10;
  initializer_list<amrex::MultiFab_*> iVar11;
  initializer_list<const_amrex::MultiFab_*> iVar12;
  BoxArray *pBVar13;
  DistributionMapping *pDVar14;
  bool bVar15;
  int iVar16;
  int *piVar17;
  Long LVar18;
  MultiFab **ppMVar19;
  pointer pMVar20;
  MLLinOp *pMVar21;
  int in_R9D;
  double in_XMM0_Qa;
  Box *box;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  uint in_stack_00000008;
  int in_stack_00000010;
  MFIter *in_stack_00000018;
  int in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  long in_stack_00000040;
  long in_stack_00000050;
  int *in_stack_00000078;
  void *in_stack_00000088;
  byte in_stack_00000090;
  Real run_time;
  int IOProc;
  Array4<const_double> *rhonew;
  Array4<const_double> *solution_1;
  Array4<double> *snew_1;
  Box *bx_5;
  MFIter mfi_5;
  Real S_tol_abs;
  Real S_tol;
  int rhoComp;
  MultiFab *rho;
  MultiFab alpha_1;
  pair<double,_double> scalars;
  Real rhsscale;
  Real b;
  Real a;
  Array4<const_double> *rho_arr_3;
  Array4<const_double> *snew_arr_1;
  Array4<double> *sol_arr_3;
  Box *bx_4;
  MFIter mfi_4;
  Array4<const_double> *rho_arr_2;
  Array4<const_double> *snew_arr;
  Array4<double> *sol_arr_2;
  Box *bx_3;
  MFIter mfi_3;
  Array4<const_double> *deltarhs;
  Array4<const_double> *alpha;
  Array4<const_double> *rho_old;
  Array4<const_double> *rhoHalf;
  Array4<const_double> dummy;
  Array4<double> *snew;
  Array4<double> *solution;
  Array4<double> *rhs;
  Box *bx_2;
  MFIter mfi_2;
  int has_delta_rhs;
  int has_alpha;
  int idim_1;
  MultiFab *weights;
  MultiFab rhs_tmp;
  Array4<const_double> *rho_arr_1;
  Array4<double> *sol_arr_1;
  Box *bx_1;
  MFIter mfi_1;
  Array4<const_double> *rho_arr;
  Array4<double> *sol_arr;
  Box *bx;
  MFIter mfi;
  Real b_1;
  Real a_1;
  int sigma;
  MLMG mgnp1;
  MLEBABecLap opnp1;
  LPInfo infonp1;
  MLMG mgn;
  MLEBABecLap opn;
  EBFArrayBoxFactory **ebf;
  LPInfo infon;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> Solnc;
  MultiFab Soln;
  MultiFab Rhs;
  FabFactory<amrex::FArrayBox> *factory;
  BoxArray *bac;
  DistributionMapping *dmc;
  DistributionMapping *dm;
  BoxArray *ba;
  Real dt;
  int ng;
  int allnull;
  int allthere;
  Real strt_time;
  bool has_coarse_data;
  int idim;
  int comp;
  int diffType;
  char (*in_stack_ffffffffffffcfc8) [35];
  undefined4 in_stack_ffffffffffffcfd0;
  int in_stack_ffffffffffffcfd4;
  undefined4 in_stack_ffffffffffffcfd8;
  int in_stack_ffffffffffffcfdc;
  MLEBABecLap *in_stack_ffffffffffffcfe0;
  Real in_stack_ffffffffffffcfe8;
  MFInfo *in_stack_ffffffffffffcff0;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_ffffffffffffcff8;
  undefined4 in_stack_ffffffffffffd000;
  uint in_stack_ffffffffffffd004;
  BoxArray *in_stack_ffffffffffffd008;
  anon_class_472_11_222ce930 *in_stack_ffffffffffffd010;
  anon_class_200_4_b2b5e107 *f;
  anon_class_200_5_4cfc6769 *in_stack_ffffffffffffd018;
  undefined1 *puVar22;
  Box *in_stack_ffffffffffffd020;
  undefined4 in_stack_ffffffffffffd028;
  undefined4 in_stack_ffffffffffffd02c;
  MLEBABecLap *in_stack_ffffffffffffd030;
  MFIter *this_00;
  undefined1 *in_stack_ffffffffffffd038;
  Print *in_stack_ffffffffffffd040;
  MultiFab *in_stack_ffffffffffffd048;
  MLLinOp *in_stack_ffffffffffffd050;
  undefined4 in_stack_ffffffffffffd058;
  uint in_stack_ffffffffffffd05c;
  MultiFab *pMVar23;
  pair<double,_double> *in_stack_ffffffffffffd068;
  MultiFab *in_stack_ffffffffffffd070;
  MultiFab *in_stack_ffffffffffffd080;
  int in_stack_ffffffffffffd088;
  Geometry *geom_00;
  Geometry *pGVar24;
  Geometry *weights_00;
  MultiFab *local_2e50;
  undefined8 ***local_2df8;
  undefined8 ***local_2de0;
  BoxArray *local_2d30;
  DistributionMapping *local_2d28;
  char *in_stack_ffffffffffffd358;
  Real in_stack_ffffffffffffd360;
  Real in_stack_ffffffffffffd368;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
  *in_stack_ffffffffffffd370;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_ffffffffffffd378;
  MLMG *in_stack_ffffffffffffd380;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_ffffffffffffd408;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_ffffffffffffd410;
  MLMG *in_stack_ffffffffffffd418;
  double local_2b68;
  int in_stack_ffffffffffffd4a0;
  int in_stack_ffffffffffffd4a4;
  MultiFab **in_stack_ffffffffffffd4a8;
  MLEBABecLap *in_stack_ffffffffffffd4b0;
  undefined1 auStack_2b18 [64];
  undefined1 auStack_2ad8 [72];
  undefined1 local_2a90 [64];
  undefined1 *local_2a50;
  undefined1 local_2a48 [64];
  undefined1 *local_2a08;
  undefined1 local_2a00 [64];
  undefined1 *local_29c0;
  undefined1 local_29b4 [139];
  undefined1 local_2929 [57];
  undefined1 *local_28f0;
  undefined1 **local_28e8;
  undefined8 local_28e0;
  Box *local_28c0;
  Real local_28b8;
  int local_28ac;
  MFIter *local_28a8;
  MultiFab *in_stack_ffffffffffffd7d0;
  MultiFab *in_stack_ffffffffffffd7d8;
  MultiFab *in_stack_ffffffffffffd7e0;
  MultiFab *in_stack_ffffffffffffd7e8;
  int in_stack_ffffffffffffd7f4;
  MLCellLinOp *in_stack_ffffffffffffd7f8;
  pair<double,_double> local_2720;
  undefined8 local_2710;
  double local_2708;
  undefined8 local_2700;
  undefined1 local_26f8 [64];
  undefined1 auStack_26b8 [64];
  undefined1 auStack_2678 [72];
  undefined1 local_2630 [64];
  undefined1 *local_25f0;
  undefined1 local_25e8 [64];
  undefined1 *local_25a8;
  undefined1 local_25a0 [64];
  undefined1 *local_2560;
  undefined1 local_2554 [28];
  undefined1 *local_2538;
  MFIter local_2530;
  undefined1 local_24d0 [64];
  undefined1 auStack_2490 [64];
  undefined1 auStack_2450 [72];
  undefined1 local_2408 [64];
  undefined1 *local_23c8;
  Real in_stack_ffffffffffffdc58;
  MultiFab *in_stack_ffffffffffffdc60;
  int in_stack_ffffffffffffdc68;
  int in_stack_ffffffffffffdc6c;
  MultiFab **in_stack_ffffffffffffdc70;
  MultiFab *in_stack_ffffffffffffdc78;
  MLMG *in_stack_ffffffffffffdc80;
  undefined1 local_2378 [64];
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_2338;
  undefined1 local_232c [36];
  MFIter local_2308;
  undefined1 local_22a8 [64];
  undefined1 auStack_2268 [64];
  undefined1 auStack_2228 [64];
  undefined1 auStack_21e8 [64];
  undefined1 auStack_21a8 [64];
  undefined1 auStack_2168 [64];
  undefined1 auStack_2128 [64];
  uint local_20e8;
  uint local_20e4;
  double local_20d8;
  undefined1 local_20d0 [64];
  undefined1 *local_2090;
  undefined1 local_2088 [64];
  undefined1 *local_2048;
  undefined1 local_2040 [64];
  undefined1 *local_2000;
  undefined1 local_1ff8 [64];
  undefined1 *local_1fb8;
  Array4<const_double> local_1fb0;
  undefined1 local_1f70 [64];
  undefined1 *local_1f30;
  undefined1 local_1f28 [64];
  undefined1 *local_1ee8;
  undefined1 local_1ee0 [64];
  undefined1 *local_1ea0;
  undefined1 local_1e94 [36];
  MFIter local_1e70;
  uint local_1e0c;
  uint local_1e08;
  int local_1e04;
  MultiFab *local_1e00;
  undefined1 local_1df1 [17];
  undefined8 local_1de0;
  undefined1 local_1db9 [73];
  undefined8 uStack_1d70;
  undefined8 local_1d68;
  undefined1 local_1d58 [384];
  undefined1 local_1bd8 [64];
  undefined1 auStack_1b98 [72];
  undefined1 local_1b50 [64];
  undefined1 *local_1b10;
  undefined1 local_1b08 [64];
  undefined1 *local_1ac8;
  undefined1 local_1abc [28];
  undefined1 *local_1aa0;
  MFIter local_1a98;
  undefined1 local_1a38 [64];
  undefined1 auStack_19f8 [72];
  undefined1 local_19b0 [64];
  undefined1 *local_1970;
  undefined1 local_1968 [64];
  undefined1 *local_1928;
  undefined1 local_191c [28];
  undefined1 *local_1900;
  MFIter local_18f8 [5];
  double local_1710;
  undefined8 local_1708;
  int local_16fc;
  MLMG local_1570;
  long local_13d0;
  long *local_13c8;
  undefined8 local_13c0;
  undefined1 local_1398 [72];
  undefined1 local_1350 [112];
  _Bit_pointer local_12e0;
  undefined1 local_12b8 [200];
  undefined1 *local_11f0;
  undefined8 local_11e8;
  MLLinOp local_11c8 [2];
  LPInfo local_df0;
  MLMG local_dd0;
  long local_c30;
  long *local_c28;
  undefined8 local_c20;
  undefined8 **local_bf8 [2];
  undefined1 ***local_be8;
  undefined8 local_be0;
  undefined1 ***local_bb8;
  undefined8 **local_bb0 [13];
  undefined1 ***local_b48;
  undefined8 local_b40;
  undefined1 local_b18 [200];
  undefined1 *local_a50;
  undefined8 local_a48;
  MLLinOp local_a28 [2];
  long local_650;
  long *local_648;
  LPInfo local_640;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined1 local_5a8 [384];
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined1 local_3f8 [384];
  MLLinOp *local_278;
  BoxArray *local_270;
  DistributionMapping *local_268;
  MultiFab *local_260;
  BoxArray *local_258;
  double local_250;
  undefined4 local_244;
  int local_240;
  double local_238;
  byte local_22d;
  int local_22c;
  int local_228;
  int local_224;
  undefined1 local_21d;
  byte local_81;
  double local_80;
  double local_78;
  double local_70;
  int local_64;
  char *local_38;
  char *local_30;
  char *local_28;
  undefined4 local_1c;
  undefined4 local_c;
  
  local_78 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_81 = in_stack_00000090 & 1;
  local_80 = in_XMM2_Qa;
  local_70 = in_XMM0_Qa;
  local_64 = in_R9D;
  if (verbose != 0) {
    amrex::OutStream();
    amrex::Print::Print((Print *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
                        (ostream *)in_stack_ffffffffffffcff8);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
               in_stack_ffffffffffffcfc8);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
               (char (*) [7])in_stack_ffffffffffffcfc8);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
               (int *)in_stack_ffffffffffffcfc8);
    local_21d = 10;
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
               *in_stack_ffffffffffffcfc8);
    amrex::Print::~Print(in_stack_ffffffffffffd040);
  }
  if ((local_64 < 1) && (-1 < (int)(local_64 + in_stack_00000008 + -1))) {
    local_28 = 
    "Diffusion::diffuse_scalar(): velocity component(s) attemping to use scalar solver. Velocity must use tensor solver.\n"
    ;
    amrex::Abort_host((char *)in_stack_ffffffffffffcfe0);
  }
  piVar17 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                      ((Vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                       (size_type)in_stack_ffffffffffffcfc8);
  local_224 = *piVar17;
  for (local_228 = 1; local_228 < (int)in_stack_00000008; local_228 = local_228 + 1) {
    piVar17 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                        ((Vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                         (size_type)in_stack_ffffffffffffcfc8);
    if (*piVar17 != local_224) {
      local_30 = 
      "All the scalars must be either diffusive or non-diffusive when calling diffuse_scalar";
      amrex::Abort_host((char *)in_stack_ffffffffffffcfe0);
    }
  }
  if (local_224 == 0) {
    for (local_22c = 0; local_22c < 3; local_22c = local_22c + 1) {
      if ((*(long *)(in_stack_00000028 + (long)local_22c * 8) != 0) &&
         (*(long *)(in_stack_00000030 + (long)local_22c * 8) != 0)) {
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
                   (value_type)in_stack_ffffffffffffcff8,
                   (int)((ulong)in_stack_ffffffffffffcff0 >> 0x20),(int)in_stack_ffffffffffffcff0,
                   (int)((ulong)in_stack_ffffffffffffcfe8 >> 0x20));
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
                   (value_type)in_stack_ffffffffffffcff8,
                   (int)((ulong)in_stack_ffffffffffffcff0 >> 0x20),(int)in_stack_ffffffffffffcff0,
                   (int)((ulong)in_stack_ffffffffffffcfe8 >> 0x20));
      }
    }
  }
  else {
    LVar18 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::size
                       ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x85bf69);
    local_22d = 1 < LVar18;
    local_238 = amrex::ParallelDescriptor::second();
    checkBeta((MultiFab **)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
              (int *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
              (int *)in_stack_ffffffffffffcfc8);
    checkBeta((Diffusion *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
              (MultiFab **)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
              (int *)in_stack_ffffffffffffcfc8);
    if (((local_240 != 0) && ((local_81 & 1) != 0)) && ((local_80 != 1.0 || (NAN(local_80))))) {
      local_38 = 
      "Diffusion::diffuse_scalar: Constant diffusivity case no longer supported separately. Must set non-zero beta."
      ;
      amrex::Abort_host((char *)in_stack_ffffffffffffcfe0);
    }
    local_244 = 1;
    local_250 = local_78 - local_70;
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::size
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x85c03f);
    ppMVar19 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                         ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                          CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                          (size_type)in_stack_ffffffffffffcfc8);
    local_258 = amrex::FabArrayBase::boxArray((FabArrayBase *)*ppMVar19);
    ppMVar19 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                         ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                          CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                          (size_type)in_stack_ffffffffffffcfc8);
    local_260 = (MultiFab *)amrex::FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar19);
    if ((local_22d & 1) == 0) {
      local_2d28 = (DistributionMapping *)0x0;
    }
    else {
      ppMVar19 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                           ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                            (size_type)in_stack_ffffffffffffcfc8);
      local_2d28 = amrex::FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar19);
    }
    local_268 = local_2d28;
    if ((local_22d & 1) == 0) {
      local_2d30 = (BoxArray *)0x0;
    }
    else {
      ppMVar19 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                           ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                            (size_type)in_stack_ffffffffffffcfc8);
      local_2d30 = amrex::FabArrayBase::boxArray((FabArrayBase *)*ppMVar19);
    }
    local_270 = local_2d30;
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
               (size_type)in_stack_ffffffffffffcfc8);
    local_278 = (MLLinOp *)
                amrex::FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x85c13d);
    local_418 = 0;
    uStack_410 = 0;
    local_428 = 0;
    uStack_420 = 0;
    local_408 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x85c1a7);
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffd010,in_stack_ffffffffffffd008,
               (DistributionMapping *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
               (int)((ulong)in_stack_ffffffffffffcff8 >> 0x20),(int)in_stack_ffffffffffffcff8,
               in_stack_ffffffffffffcff0,(FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffd020);
    amrex::MFInfo::~MFInfo((MFInfo *)0x85c1f8);
    local_5c8 = 0;
    uStack_5c0 = 0;
    local_5d8 = 0;
    uStack_5d0 = 0;
    local_5b8 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x85c25a);
    pMVar21 = local_278;
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffd010,in_stack_ffffffffffffd008,
               (DistributionMapping *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
               (int)((ulong)in_stack_ffffffffffffcff8 >> 0x20),(int)in_stack_ffffffffffffcff8,
               in_stack_ffffffffffffcff0,(FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffd020);
    amrex::MFInfo::~MFInfo((MFInfo *)0x85c2a9);
    operator_new(0x180);
    amrex::MultiFab::MultiFab
              ((MultiFab *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
    std::unique_ptr<amrex::MultiFab,std::default_delete<amrex::MultiFab>>::
    unique_ptr<std::default_delete<amrex::MultiFab>,void>
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),(pointer)pMVar21);
    if ((local_22d & 1) != 0) {
      pMVar20 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                          ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                           0x85c2fa);
      pDVar14 = local_268;
      pBVar13 = local_270;
      local_5f8 = 0;
      uStack_5f0 = 0;
      local_608 = 0;
      uStack_600 = 0;
      local_5e8 = 0;
      amrex::MFInfo::MFInfo((MFInfo *)0x85c364);
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),(size_type)pMVar21);
      pMVar21 = (MLLinOp *)
                amrex::FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x85c37e);
      (*(pMVar20->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
                (pMVar20,pBVar13,pDVar14,(ulong)in_stack_00000008,0,&local_608);
      amrex::MFInfo::~MFInfo((MFInfo *)0x85c3c9);
    }
    amrex::LPInfo::LPInfo(&local_640);
    amrex::LPInfo::setAgglomeration(&local_640,(anonymous_namespace)::agglomeration != 0);
    amrex::LPInfo::setConsolidation(&local_640,(anonymous_namespace)::consolidation != 0);
    amrex::LPInfo::setMaxCoarseningLevel(&local_640,0);
    local_650 = __dynamic_cast(local_278,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                               &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (local_650 == 0) {
      __cxa_bad_cast();
    }
    local_648 = &local_650;
    memcpy(local_b18,in_stack_00000088,200);
    local_a48 = 1;
    local_a50 = local_b18;
    std::allocator<amrex::Geometry>::allocator((allocator<amrex::Geometry> *)0x85c556);
    iVar1._M_array._4_4_ = in_stack_ffffffffffffcfdc;
    iVar1._M_array._0_4_ = in_stack_ffffffffffffcfd8;
    iVar1._M_len = (size_type)in_stack_ffffffffffffcfe0;
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),iVar1,
               (allocator_type *)pMVar21);
    local_bb8 = (undefined1 ***)local_bb0;
    amrex::BoxArray::BoxArray
              ((BoxArray *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
               (BoxArray *)pMVar21);
    local_b48 = (undefined1 ***)local_bb0;
    local_b40 = 1;
    std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x85c5cd);
    iVar2._M_array._4_4_ = in_stack_ffffffffffffcfdc;
    iVar2._M_array._0_4_ = in_stack_ffffffffffffcfd8;
    iVar2._M_len = (size_type)in_stack_ffffffffffffcfe0;
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),iVar2,
               (allocator_type *)pMVar21);
    amrex::DistributionMapping::DistributionMapping
              ((DistributionMapping *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
               (DistributionMapping *)pMVar21);
    local_be0 = 1;
    local_be8 = (undefined1 ***)local_bf8;
    std::allocator<amrex::DistributionMapping>::allocator
              ((allocator<amrex::DistributionMapping> *)0x85c642);
    iVar3._M_array._4_4_ = in_stack_ffffffffffffcfdc;
    iVar3._M_array._0_4_ = in_stack_ffffffffffffcfd8;
    iVar3._M_len = (size_type)in_stack_ffffffffffffcfe0;
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),iVar3,
               (allocator_type *)pMVar21);
    local_c30 = *local_648;
    local_c28 = &local_c30;
    local_c20 = 1;
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x85c6ad);
    iVar4._M_array._4_4_ = in_stack_ffffffffffffcfdc;
    iVar4._M_array._0_4_ = in_stack_ffffffffffffcfd8;
    iVar4._M_len = (size_type)in_stack_ffffffffffffcfe0;
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),iVar4,
           (allocator_type *)pMVar21);
    pMVar21 = (MLLinOp *)CONCAT44((int)((ulong)pMVar21 >> 0x20),in_stack_00000008);
    amrex::MLEBABecLap::MLEBABecLap
              (in_stack_ffffffffffffd030,
               (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_ffffffffffffd02c,in_stack_ffffffffffffd028),
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_ffffffffffffd020,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_ffffffffffffd018,(LPInfo *)in_stack_ffffffffffffd010,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)in_stack_ffffffffffffd008,(int)in_stack_ffffffffffffd040);
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    ~Vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
             *)0x85c724);
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::~allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x85c731);
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~Vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               0x85c73e);
    std::allocator<amrex::DistributionMapping>::~allocator
              ((allocator<amrex::DistributionMapping> *)0x85c74b);
    local_2de0 = &local_be8;
    do {
      local_2de0 = local_2de0 + -2;
      amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0x85c780);
    } while (local_2de0 != local_bf8);
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x85c7aa);
    std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x85c7b7);
    local_2df8 = &local_b48;
    do {
      local_2df8 = local_2df8 + -0xd;
      amrex::BoxArray::~BoxArray
                ((BoxArray *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
    } while (local_2df8 != local_bb0);
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~Vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x85c816);
    std::allocator<amrex::Geometry>::~allocator((allocator<amrex::Geometry> *)0x85c823);
    amrex::MLLinOp::setMaxOrder(local_a28,max_order);
    amrex::MLMG::MLMG((MLMG *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),pMVar21)
    ;
    amrex::MLMG::setVerbose(&local_dd0,verbose);
    amrex::LPInfo::LPInfo(&local_df0);
    amrex::LPInfo::setAgglomeration(&local_df0,(anonymous_namespace)::agglomeration != 0);
    amrex::LPInfo::setConsolidation(&local_df0,(anonymous_namespace)::consolidation != 0);
    memcpy(local_12b8,in_stack_00000088,200);
    local_11e8 = 1;
    local_11f0 = local_12b8;
    std::allocator<amrex::Geometry>::allocator((allocator<amrex::Geometry> *)0x85c906);
    iVar5._M_array._4_4_ = in_stack_ffffffffffffcfdc;
    iVar5._M_array._0_4_ = in_stack_ffffffffffffcfd8;
    iVar5._M_len = (size_type)in_stack_ffffffffffffcfe0;
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),iVar5,
               (allocator_type *)pMVar21);
    local_1398._64_8_ = local_1350;
    amrex::BoxArray::BoxArray
              ((BoxArray *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
               (BoxArray *)pMVar21);
    local_1350._104_8_ = local_1350;
    local_12e0 = (_Bit_pointer)0x1;
    std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x85c97d);
    iVar6._M_array._4_4_ = in_stack_ffffffffffffcfdc;
    iVar6._M_array._0_4_ = in_stack_ffffffffffffcfd8;
    iVar6._M_len = (size_type)in_stack_ffffffffffffcfe0;
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),iVar6,
               (allocator_type *)pMVar21);
    amrex::DistributionMapping::DistributionMapping
              ((DistributionMapping *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
               (DistributionMapping *)pMVar21);
    local_1398._24_8_ = 1;
    local_1398._16_8_ = local_1398;
    std::allocator<amrex::DistributionMapping>::allocator
              ((allocator<amrex::DistributionMapping> *)0x85c9f2);
    iVar7._M_array._4_4_ = in_stack_ffffffffffffcfdc;
    iVar7._M_array._0_4_ = in_stack_ffffffffffffcfd8;
    iVar7._M_len = (size_type)in_stack_ffffffffffffcfe0;
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),iVar7,
               (allocator_type *)pMVar21);
    local_13d0 = *local_648;
    local_13c8 = &local_13d0;
    local_13c0 = 1;
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x85ca5d);
    iVar8._M_array._4_4_ = in_stack_ffffffffffffcfdc;
    iVar8._M_array._0_4_ = in_stack_ffffffffffffcfd8;
    iVar8._M_len = (size_type)in_stack_ffffffffffffcfe0;
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),iVar8,
           (allocator_type *)pMVar21);
    pMVar21 = (MLLinOp *)CONCAT44((int)((ulong)pMVar21 >> 0x20),in_stack_00000008);
    amrex::MLEBABecLap::MLEBABecLap
              (in_stack_ffffffffffffd030,
               (Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               CONCAT44(in_stack_ffffffffffffd02c,in_stack_ffffffffffffd028),
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_ffffffffffffd020,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_ffffffffffffd018,(LPInfo *)in_stack_ffffffffffffd010,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)in_stack_ffffffffffffd008,(int)in_stack_ffffffffffffd040);
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    ~Vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
             *)0x85cad4);
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::~allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x85cae1);
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~Vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               0x85caee);
    std::allocator<amrex::DistributionMapping>::~allocator
              ((allocator<amrex::DistributionMapping> *)0x85cafb);
    pMVar23 = (MultiFab *)local_1398;
    local_2e50 = (MultiFab *)(local_1398 + 0x10);
    do {
      local_2e50 = (MultiFab *)&local_2e50[-1].super_FabArray<amrex::FArrayBox>.pcd;
      amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0x85cb30);
    } while (local_2e50 != pMVar23);
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x85cb5a);
    std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x85cb67);
    pGVar24 = (Geometry *)local_1350;
    geom_00 = (Geometry *)(local_1350 + 0x68);
    do {
      geom_00 = (Geometry *)(geom_00[-1].prob_domain.xlo + 1);
      amrex::BoxArray::~BoxArray
                ((BoxArray *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
    } while (geom_00 != pGVar24);
    weights_00 = geom_00;
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~Vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x85cbc6);
    std::allocator<amrex::Geometry>::~allocator((allocator<amrex::Geometry> *)0x85cbd3);
    amrex::MLLinOp::setMaxOrder(local_11c8,max_order);
    amrex::MLMG::MLMG((MLMG *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),pMVar21)
    ;
    if ((anonymous_namespace)::use_hypre != 0) {
      amrex::MLMG::setBottomSolver(&local_1570,hypre);
      amrex::MLMG::setBottomVerbose(&local_1570,(anonymous_namespace)::hypre_verbose);
    }
    amrex::MLMG::setMaxFmgIter(&local_1570,(anonymous_namespace)::max_fmg_iter);
    amrex::MLMG::setVerbose(&local_1570,verbose);
    setDomainBC((array<amrex::LinOpBCType,_3UL> *)in_stack_ffffffffffffcfe0,
                (array<amrex::LinOpBCType,_3UL> *)
                CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                (BCRec *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
    amrex::MLLinOp::setDomainBC
              (in_stack_ffffffffffffd050,(Array<BCType,_3> *)in_stack_ffffffffffffd048,
               (Array<BCType,_3> *)in_stack_ffffffffffffd040);
    amrex::MLLinOp::setDomainBC
              (in_stack_ffffffffffffd050,(Array<BCType,_3> *)in_stack_ffffffffffffd048,
               (Array<BCType,_3> *)in_stack_ffffffffffffd040);
    if (verbose != 0) {
      amrex::OutStream();
      amrex::Print::Print((Print *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
                          (ostream *)in_stack_ffffffffffffcff8);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                 (char (*) [14])pMVar21);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                 (int *)pMVar21);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                 (char (*) [11])pMVar21);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                 (char (*) [10])pMVar21);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                 (int *)pMVar21);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                 (char (*) [2])pMVar21);
      amrex::Print::~Print(in_stack_ffffffffffffd040);
    }
    local_16fc = local_64;
    if (((local_81 & 1) == 0) || ((local_80 == 1.0 && (!NAN(local_80))))) {
      for (local_1e04 = 0; local_1e04 < 3; local_1e04 = local_1e04 + 1) {
        amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
                   (value_type)in_stack_ffffffffffffcff8,
                   (int)((ulong)in_stack_ffffffffffffcff0 >> 0x20),(int)in_stack_ffffffffffffcff0,
                   (int)((ulong)in_stack_ffffffffffffcfe8 >> 0x20));
      }
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),(value_type)pMVar21);
    }
    else {
      local_1708 = 0;
      local_1710 = -(1.0 - local_80) * local_250;
      if (verbose != 0) {
        amrex::OutStream();
        amrex::Print::Print((Print *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
                            (ostream *)in_stack_ffffffffffffcff8);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                   (char (*) [26])pMVar21);
        amrex::Print::~Print(in_stack_ffffffffffffd040);
      }
      if ((local_22d & 1) != 0) {
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),(size_type)pMVar21)
        ;
        amrex::MultiFab::Copy
                  ((MultiFab *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
                   (MultiFab *)in_stack_ffffffffffffcff8,
                   (int)((ulong)in_stack_ffffffffffffcff0 >> 0x20),(int)in_stack_ffffffffffffcff0,
                   (int)((ulong)in_stack_ffffffffffffcfe8 >> 0x20),
                   SUB84(in_stack_ffffffffffffcfe8,0));
        if (in_stack_00000020 == 2) {
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                     CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
          amrex::TilingIfNotGPU();
          amrex::MFIter::MFIter
                    ((MFIter *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
                     in_stack_ffffffffffffcff8,SUB81((ulong)in_stack_ffffffffffffcff0 >> 0x38,0));
          while (bVar15 = amrex::MFIter::isValid(local_18f8), bVar15) {
            amrex::MFIter::tilebox((MFIter *)in_stack_ffffffffffffd030);
            local_1900 = local_191c;
            std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                      ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                       0x85d412);
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)
                       CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                       (MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
            local_1928 = local_1968;
            amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                      ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                       (size_type)pMVar21);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffcfe0,
                       (MFIter *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                       in_stack_ffffffffffffcfd4);
            local_1970 = local_19b0;
            memcpy(local_1a38,local_1928,0x3c);
            memcpy(auStack_19f8,local_1970,0x3c);
            amrex::
            ParallelFor<Diffusion::diffuse_scalar(amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,int,int,int,double,double,double,amrex::MultiFab_const&,int,amrex::MultiFab*const*,amrex::MultiFab*const*,int,amrex::MultiFab*,int,amrex::MultiFab_const*,int,amrex::MultiFab_const*const*,amrex::MultiFab_const*const*,int,amrex::IntVect_const&,amrex::BCRec_const&,amrex::Geometry_const&,bool,amrex::Vector<int,std::allocator<int>>const&)::__0>
                      (in_stack_ffffffffffffd020,
                       (anon_class_136_3_59341dd0 *)in_stack_ffffffffffffd018);
            amrex::MFIter::operator++(local_18f8);
          }
          amrex::MFIter::~MFIter
                    ((MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
        }
        pMVar20 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                             CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
        local_c = 0;
        amrex::MLLinOp::setCoarseFineBC(local_a28,pMVar20,*in_stack_00000078);
      }
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),(size_type)pMVar21);
      amrex::MultiFab::Copy
                ((MultiFab *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
                 (MultiFab *)in_stack_ffffffffffffcff8,
                 (int)((ulong)in_stack_ffffffffffffcff0 >> 0x20),(int)in_stack_ffffffffffffcff0,
                 (int)((ulong)in_stack_ffffffffffffcfe8 >> 0x20),SUB84(in_stack_ffffffffffffcfe8,0))
      ;
      if (in_stack_00000020 == 2) {
        amrex::TilingIfNotGPU();
        amrex::MFIter::MFIter
                  ((MFIter *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
                   in_stack_ffffffffffffcff8,SUB81((ulong)in_stack_ffffffffffffcff0 >> 0x38,0));
        while (bVar15 = amrex::MFIter::isValid(&local_1a98), bVar15) {
          amrex::MFIter::growntilebox
                    ((MFIter *)in_stack_ffffffffffffd040,
                     (int)((ulong)in_stack_ffffffffffffd038 >> 0x20));
          local_1aa0 = local_1abc;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)
                     CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                     (MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
          local_1ac8 = local_1b08;
          amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                    ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                     CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                     (size_type)pMVar21);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffcfe0,
                     (MFIter *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                     in_stack_ffffffffffffcfd4);
          local_1b10 = local_1b50;
          memcpy(local_1bd8,local_1ac8,0x3c);
          memcpy(auStack_1b98,local_1b10,0x3c);
          amrex::
          ParallelFor<Diffusion::diffuse_scalar(amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,int,int,int,double,double,double,amrex::MultiFab_const&,int,amrex::MultiFab*const*,amrex::MultiFab*const*,int,amrex::MultiFab*,int,amrex::MultiFab_const*,int,amrex::MultiFab_const*const*,amrex::MultiFab_const*const*,int,amrex::IntVect_const&,amrex::BCRec_const&,amrex::Geometry_const&,bool,amrex::Vector<int,std::allocator<int>>const&)::__1>
                    (in_stack_ffffffffffffd020,
                     (anon_class_136_3_59341dd0 *)in_stack_ffffffffffffd018);
          amrex::MFIter::operator++(&local_1a98);
        }
        amrex::MFIter::~MFIter
                  ((MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
      }
      amrex::MLCellLinOp::setLevelBC
                (in_stack_ffffffffffffd7f8,in_stack_ffffffffffffd7f4,in_stack_ffffffffffffd7e8,
                 in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8,in_stack_ffffffffffffd7d0);
      amrex::MLEBABecLap::setScalars
                (in_stack_ffffffffffffcfe0,
                 (Real)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                 (Real)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
      setBeta(in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8,in_stack_ffffffffffffd4a4,
              in_stack_ffffffffffffd4a0);
      local_1db9._65_8_ = 0;
      uStack_1d70 = 0;
      local_1db9._49_8_ = 0;
      local_1db9._57_8_ = 0;
      local_1d68 = 0;
      in_stack_ffffffffffffd080 = local_260;
      amrex::MFInfo::MFInfo((MFInfo *)0x85d7bd);
      pMVar21 = local_278;
      amrex::MultiFab::MultiFab
                ((MultiFab *)in_stack_ffffffffffffd010,in_stack_ffffffffffffd008,
                 (DistributionMapping *)
                 CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
                 (int)((ulong)in_stack_ffffffffffffcff8 >> 0x20),(int)in_stack_ffffffffffffcff8,
                 in_stack_ffffffffffffcff0,(FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffd020
                );
      amrex::MFInfo::~MFInfo((MFInfo *)0x85d80c);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),(value_type)pMVar21);
      local_1db9._1_8_ = local_1db9 + 0x61;
      local_1db9._9_8_ = local_1db9 + 1;
      local_1db9._17_8_ = 1;
      in_stack_ffffffffffffd070 = (MultiFab *)local_1db9;
      std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x85d85f);
      iVar9._M_array._4_4_ = in_stack_ffffffffffffcfdc;
      iVar9._M_array._0_4_ = in_stack_ffffffffffffcfd8;
      iVar9._M_len = (size_type)in_stack_ffffffffffffcfe0;
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),iVar9,
                 (allocator_type *)pMVar21);
      local_1df1._1_8_ = local_5a8;
      local_1df1._9_8_ = local_1df1 + 1;
      local_1de0 = 1;
      in_stack_ffffffffffffd068 = (pair<double,_double> *)local_1df1;
      std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x85d8c7);
      iVar10._M_array._4_4_ = in_stack_ffffffffffffcfdc;
      iVar10._M_array._0_4_ = in_stack_ffffffffffffcfd8;
      iVar10._M_len = (size_type)in_stack_ffffffffffffcfe0;
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),iVar10,
                 (allocator_type *)pMVar21);
      amrex::MLMG::apply(in_stack_ffffffffffffd418,in_stack_ffffffffffffd410,
                         in_stack_ffffffffffffd408);
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x85d91a);
      std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x85d927);
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x85d934);
      std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x85d941);
      local_1e00 = amrex::EBFArrayBoxFactory::getVolFrac
                             ((EBFArrayBoxFactory *)
                              CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
      amrex::single_level_weighted_redistribute
                (pMVar23,local_2e50,(MultiFab *)weights_00,(int)((ulong)pGVar24 >> 0x20),
                 (int)pGVar24,geom_00);
      computeExtensiveFluxes
                (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70,
                 in_stack_ffffffffffffdc6c,in_stack_ffffffffffffdc68,in_stack_ffffffffffffdc60,
                 in_stack_ffffffffffffdc58);
      amrex::MultiFab::~MultiFab((MultiFab *)0x85d9f9);
    }
    local_1e08 = (uint)(in_stack_00000050 != 0);
    local_1e0c = (uint)(in_stack_00000040 != 0);
    ppMVar19 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                         ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                          CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                          (size_type)pMVar21);
    pMVar23 = *ppMVar19;
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
               in_stack_ffffffffffffcff8,SUB81((ulong)in_stack_ffffffffffffcff0 >> 0x38,0));
    while (bVar15 = amrex::MFIter::isValid(&local_1e70), bVar15) {
      amrex::MFIter::tilebox((MFIter *)in_stack_ffffffffffffd030);
      local_1e94._28_8_ = local_1e94;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                 (MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
      local_1ea0 = local_1ee0;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                 (MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
      local_1ee8 = local_1f28;
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),(size_type)pMVar21);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffcfe0,
                 (MFIter *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                 in_stack_ffffffffffffcfd4);
      local_1f30 = local_1f70;
      amrex::Array4<const_double>::Array4(&local_1fb0);
      if (in_stack_00000020 == 1) {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                   (MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
      }
      else {
        memcpy(local_1ff8,&local_1fb0,0x3c);
      }
      local_1fb8 = local_1ff8;
      if (in_stack_00000020 == 3) {
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),(size_type)pMVar21)
        ;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffcfe0,
                   (MFIter *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                   in_stack_ffffffffffffcfd4);
      }
      else {
        memcpy(local_2040,&local_1fb0,0x3c);
      }
      local_2000 = local_2040;
      if (local_1e08 == 0) {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                   (MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
      }
      else {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffcfe0,
                   (MFIter *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                   in_stack_ffffffffffffcfd4);
      }
      local_2048 = local_2088;
      if (local_1e0c == 0) {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                   (MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
      }
      else {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffcfe0,
                   (MFIter *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                   in_stack_ffffffffffffcfd4);
      }
      local_2090 = local_20d0;
      in_stack_ffffffffffffd050 = (MLLinOp *)local_1e94._28_8_;
      in_stack_ffffffffffffd05c = in_stack_00000008;
      memcpy(local_22a8,local_1ea0,0x3c);
      memcpy(auStack_2268,local_1ee8,0x3c);
      memcpy(auStack_2228,local_1f30,0x3c);
      memcpy(auStack_21e8,local_1fb8,0x3c);
      memcpy(auStack_21a8,local_2000,0x3c);
      memcpy(auStack_2168,local_2048,0x3c);
      memcpy(auStack_2128,local_2090,0x3c);
      local_20e8 = local_1e08;
      local_20e4 = local_1e0c;
      local_20d8 = local_250;
      amrex::
      ParallelFor<int,Diffusion::diffuse_scalar(amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,int,int,int,double,double,double,amrex::MultiFab_const&,int,amrex::MultiFab*const*,amrex::MultiFab*const*,int,amrex::MultiFab*,int,amrex::MultiFab_const*,int,amrex::MultiFab_const*const*,amrex::MultiFab_const*const*,int,amrex::IntVect_const&,amrex::BCRec_const&,amrex::Geometry_const&,bool,amrex::Vector<int,std::allocator<int>>const&)::__2,void>
                (in_stack_ffffffffffffd020,(int)((ulong)in_stack_ffffffffffffd018 >> 0x20),
                 in_stack_ffffffffffffd010);
      amrex::MFIter::operator++(&local_1e70);
    }
    amrex::MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
    if ((local_22d & 1) != 0) {
      in_stack_ffffffffffffd048 =
           std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                     ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                      CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
      amrex::TilingIfNotGPU();
      amrex::MFIter::MFIter
                ((MFIter *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
                 in_stack_ffffffffffffcff8,SUB81((ulong)in_stack_ffffffffffffcff0 >> 0x38,0));
      while (bVar15 = amrex::MFIter::isValid(&local_2308), bVar15) {
        amrex::MFIter::tilebox((MFIter *)in_stack_ffffffffffffd030);
        local_232c._28_8_ = local_232c;
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x85dffb);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                   (MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
        local_2338._M_head_impl = (MultiFab *)local_2378;
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),(size_type)pMVar21)
        ;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffcfe0,
                   (MFIter *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                   in_stack_ffffffffffffcfd4);
        in_stack_ffffffffffffdc80 = (MLMG *)&stack0xffffffffffffdc40;
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),(size_type)pMVar21)
        ;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffcfe0,
                   (MFIter *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                   in_stack_ffffffffffffcfd4);
        local_23c8 = local_2408;
        in_stack_ffffffffffffd040 = (Print *)local_232c._28_8_;
        memcpy(local_24d0,local_2338._M_head_impl,0x3c);
        memcpy(auStack_2490,in_stack_ffffffffffffdc80,0x3c);
        memcpy(auStack_2450,local_23c8,0x3c);
        amrex::
        ParallelFor<Diffusion::diffuse_scalar(amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,int,int,int,double,double,double,amrex::MultiFab_const&,int,amrex::MultiFab*const*,amrex::MultiFab*const*,int,amrex::MultiFab*,int,amrex::MultiFab_const*,int,amrex::MultiFab_const*const*,amrex::MultiFab_const*const*,int,amrex::IntVect_const&,amrex::BCRec_const&,amrex::Geometry_const&,bool,amrex::Vector<int,std::allocator<int>>const&)::__3>
                  (in_stack_ffffffffffffd020,in_stack_ffffffffffffd018);
        amrex::MFIter::operator++(&local_2308);
      }
      amrex::MFIter::~MFIter
                ((MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
      pMVar20 = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                          ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                           CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
      local_1c = 0;
      amrex::MLLinOp::setCoarseFineBC(local_11c8,pMVar20,*in_stack_00000078);
    }
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
               in_stack_ffffffffffffcff8,SUB81((ulong)in_stack_ffffffffffffcff0 >> 0x38,0));
    while( true ) {
      iVar16 = (int)((ulong)in_stack_ffffffffffffd038 >> 0x20);
      bVar15 = amrex::MFIter::isValid(&local_2530);
      if (!bVar15) break;
      amrex::MFIter::growntilebox((MFIter *)in_stack_ffffffffffffd040,iVar16);
      local_2538 = local_2554;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                 (MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
      local_2560 = local_25a0;
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),(size_type)pMVar21);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffcfe0,
                 (MFIter *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                 in_stack_ffffffffffffcfd4);
      local_25a8 = local_25e8;
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),(size_type)pMVar21);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffcfe0,
                 (MFIter *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                 in_stack_ffffffffffffcfd4);
      local_25f0 = local_2630;
      in_stack_ffffffffffffd038 = local_2538;
      memcpy(local_26f8,local_2560,0x3c);
      memcpy(auStack_26b8,local_25a8,0x3c);
      memcpy(auStack_2678,local_25f0,0x3c);
      amrex::
      ParallelFor<Diffusion::diffuse_scalar(amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,int,int,int,double,double,double,amrex::MultiFab_const&,int,amrex::MultiFab*const*,amrex::MultiFab*const*,int,amrex::MultiFab*,int,amrex::MultiFab_const*,int,amrex::MultiFab_const*const*,amrex::MultiFab_const*const*,int,amrex::IntVect_const&,amrex::BCRec_const&,amrex::Geometry_const&,bool,amrex::Vector<int,std::allocator<int>>const&)::__4>
                (in_stack_ffffffffffffd020,in_stack_ffffffffffffd018);
      amrex::MFIter::operator++(&local_2530);
    }
    amrex::MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
    amrex::MLCellLinOp::setLevelBC
              (in_stack_ffffffffffffd7f8,in_stack_ffffffffffffd7f4,in_stack_ffffffffffffd7e8,
               in_stack_ffffffffffffd7e0,in_stack_ffffffffffffd7d8,in_stack_ffffffffffffd7d0);
    local_2700 = 0x3ff0000000000000;
    local_2708 = local_80 * local_250;
    local_2710 = 0x3ff0000000000000;
    std::pair<double,_double>::pair<double,_double,_true>(&local_2720);
    amrex::MultiFab::MultiFab
              ((MultiFab *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0));
    if (in_stack_00000020 == 1) {
      in_stack_00000010 = 0;
    }
    else {
      ppMVar19 = amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                           ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            CONCAT44(in_stack_ffffffffffffcfd4,in_stack_ffffffffffffcfd0),
                            (size_type)pMVar21);
      in_stack_00000018 = (MFIter *)*ppMVar19;
    }
    this_00 = in_stack_00000018;
    local_28ac = in_stack_00000010;
    local_28a8 = in_stack_00000018;
    computeAlpha(in_stack_ffffffffffffd070,in_stack_ffffffffffffd068,(Real)pMVar23,
                 (Real)CONCAT44(in_stack_ffffffffffffd05c,in_stack_ffffffffffffd058),
                 (Real *)in_stack_ffffffffffffd050,in_stack_ffffffffffffd048,
                 (int)((ulong)in_stack_ffffffffffffd040 >> 0x20),(int)in_stack_ffffffffffffd040,
                 in_stack_ffffffffffffd080,in_stack_ffffffffffffd088);
    amrex::MLEBABecLap::setScalars
              (in_stack_ffffffffffffcfe0,
               (Real)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
               (Real)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010));
    amrex::MLEBABecLap::setACoeffs
              (in_stack_ffffffffffffcfe0,in_stack_ffffffffffffcfdc,
               (MultiFab *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010));
    amrex::MultiFab::~MultiFab((MultiFab *)0x85e4dd);
    setBeta(in_stack_ffffffffffffd4b0,in_stack_ffffffffffffd4a8,in_stack_ffffffffffffd4a4,
            in_stack_ffffffffffffd4a0);
    amrex::MultiFab::mult
              ((MultiFab *)in_stack_ffffffffffffcfe0,
               (Real)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
               in_stack_ffffffffffffcfd4,in_stack_00000010,(int)((ulong)in_stack_00000018 >> 0x20));
    local_28b8 = visc_tol;
    box = (Box *)get_scaled_abs_tol((MultiFab *)in_stack_ffffffffffffcff0,in_stack_ffffffffffffcfe8)
    ;
    do_tiling_ = (undefined1)((ulong)in_stack_ffffffffffffcff0 >> 0x38);
    local_28f0 = local_5a8;
    local_28e8 = &local_28f0;
    local_28e0 = 1;
    puVar22 = local_2929 + 0x38;
    local_28c0 = box;
    std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x85e5a0);
    iVar11._M_array._4_4_ = in_stack_ffffffffffffcfdc;
    iVar11._M_array._0_4_ = in_stack_ffffffffffffcfd8;
    iVar11._M_len = (size_type)in_stack_ffffffffffffcfe0;
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010),iVar11,
               (allocator_type *)in_stack_00000018);
    local_2929._1_8_ = local_3f8;
    local_2929._9_8_ = local_2929 + 1;
    local_2929._17_8_ = 1;
    f = (anon_class_200_4_b2b5e107 *)local_2929;
    std::allocator<const_amrex::MultiFab_*>::allocator
              ((allocator<const_amrex::MultiFab_*> *)0x85e602);
    iVar12._M_array._4_4_ = in_stack_ffffffffffffcfdc;
    iVar12._M_array._0_4_ = in_stack_ffffffffffffcfd8;
    iVar12._M_len = (size_type)in_stack_ffffffffffffcfe0;
    amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010),iVar12,
               (allocator_type *)in_stack_00000018);
    amrex::MLMG::solve(in_stack_ffffffffffffd380,in_stack_ffffffffffffd378,in_stack_ffffffffffffd370
                       ,in_stack_ffffffffffffd368,in_stack_ffffffffffffd360,
                       in_stack_ffffffffffffd358);
    amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x85e668
              );
    std::allocator<const_amrex::MultiFab_*>::~allocator
              ((allocator<const_amrex::MultiFab_*> *)0x85e675);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x85e682);
    std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x85e68f);
    computeExtensiveFluxes
              (in_stack_ffffffffffffdc80,in_stack_ffffffffffffdc78,in_stack_ffffffffffffdc70,
               in_stack_ffffffffffffdc6c,in_stack_ffffffffffffdc68,in_stack_ffffffffffffdc60,
               in_stack_ffffffffffffdc58);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010),(size_type)in_stack_00000018);
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
               in_stack_ffffffffffffcff8,(bool)do_tiling_);
    while (bVar15 = amrex::MFIter::isValid((MFIter *)(local_29b4 + 0x24)), bVar15) {
      amrex::MFIter::tilebox(this_00);
      local_29b4._28_8_ = local_29b4;
      amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010),(size_type)in_stack_00000018)
      ;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffcfe0,
                 (MFIter *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                 in_stack_ffffffffffffcfd4);
      local_29c0 = local_2a00;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                 (MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010));
      local_2a08 = local_2a48;
      if (in_stack_00000020 == 2) {
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010),
                   (size_type)in_stack_00000018);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffcfe0,
                   (MFIter *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                   in_stack_ffffffffffffcfd4);
      }
      else {
        amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                  ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010),
                   (size_type)in_stack_00000018);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffcfe0,
                   (MFIter *)CONCAT44(in_stack_ffffffffffffcfdc,in_stack_ffffffffffffcfd8),
                   in_stack_ffffffffffffcfd4);
      }
      local_2a50 = local_2a90;
      in_stack_ffffffffffffcff8 = (FabArrayBase *)local_29b4._28_8_;
      in_stack_ffffffffffffd004 = in_stack_00000008;
      memcpy(&stack0xffffffffffffd4a8,local_29c0,0x3c);
      memcpy(auStack_2b18,local_2a08,0x3c);
      memcpy(auStack_2ad8,local_2a50,0x3c);
      amrex::
      ParallelFor<int,Diffusion::diffuse_scalar(amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>&,amrex::Vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>const&,int,int,int,double,double,double,amrex::MultiFab_const&,int,amrex::MultiFab*const*,amrex::MultiFab*const*,int,amrex::MultiFab*,int,amrex::MultiFab_const*,int,amrex::MultiFab_const*const*,amrex::MultiFab_const*const*,int,amrex::IntVect_const&,amrex::BCRec_const&,amrex::Geometry_const&,bool,amrex::Vector<int,std::allocator<int>>const&)::__5,void>
                (box,(int)((ulong)puVar22 >> 0x20),f);
      amrex::MFIter::operator++((MFIter *)(local_29b4 + 0x24));
    }
    amrex::MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010));
    if (verbose != 0) {
      iVar16 = amrex::ParallelDescriptor::IOProcessorNumber();
      local_2b68 = amrex::ParallelDescriptor::second();
      local_2b68 = local_2b68 - local_238;
      amrex::ParallelDescriptor::ReduceRealMax<double>(&local_2b68,iVar16);
      amrex::OutStream();
      amrex::Print::Print((Print *)CONCAT44(in_stack_ffffffffffffd004,in_stack_ffffffffffffd000),
                          (ostream *)in_stack_ffffffffffffcff8);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010),
                 (char (*) [35])in_stack_00000018);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010),
                 (double *)in_stack_00000018);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010),
                 (char *)in_stack_00000018);
      amrex::Print::~Print(in_stack_ffffffffffffd040);
    }
    amrex::MLMG::~MLMG((MLMG *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010));
    amrex::MLEBABecLap::~MLEBABecLap
              ((MLEBABecLap *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010));
    amrex::MLMG::~MLMG((MLMG *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010));
    amrex::MLEBABecLap::~MLEBABecLap
              ((MLEBABecLap *)CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010));
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               CONCAT44(in_stack_ffffffffffffcfd4,in_stack_00000010));
    amrex::MultiFab::~MultiFab((MultiFab *)0x85ead2);
    amrex::MultiFab::~MultiFab((MultiFab *)0x85eadf);
  }
  return;
}

Assistant:

void
Diffusion::diffuse_scalar (const Vector<MultiFab*>&  S_old,
                           const Vector<MultiFab*>&  Rho_old,
                           Vector<MultiFab*>&        S_new,
                           const Vector<MultiFab*>&  Rho_new,
                           int                       S_comp,
                           int                       nComp,
                           int                       Rho_comp,
                           Real                      prev_time,
                           Real                      curr_time,
                           Real                      be_cn_theta,
                           const MultiFab&           rho_half,
                           int                       rho_flag,
                           MultiFab* const*          fluxn,
                           MultiFab* const*          fluxnp1,
                           int                       fluxComp,
                           MultiFab*                 delta_rhs,
                           int                       rhsComp,
                           const MultiFab*           alpha_in,
                           int                       alpha_in_comp,
                           const MultiFab* const*    betan,
                           const MultiFab* const*    betanp1,
                           int                       betaComp,
                           const IntVect&            cratio,
                           const BCRec&              bc,
                           const Geometry&           geom,
                           bool                      add_old_time_divFlux,
                           const amrex::Vector<int>& a_is_diffusive)
{
    //
    // This routine expects that physical BC's have been loaded into
    // the grow cells of the old and new state at this level.  If rho_flag==2,
    // the values there are rho.phi, where phi is the quantity being diffused.
    // Values in these cells will be preserved.  Also, if there are any
    // explicit update terms, these have already incremented the new state
    // on the valid region (i.e., on the valid region the new state is the old
    // state + dt*Div(explicit_fluxes), e.g.)
    //

    if (verbose)
      amrex::Print() << "... Diffusion::diffuse_scalar(): \n"
                     << " lev: " << level << '\n';

    // Velocity components should go to tensor solver
    if (S_comp <= Xvel && Xvel <= S_comp+nComp-1){
       amrex::Abort("Diffusion::diffuse_scalar(): velocity component(s) attemping to use scalar solver. Velocity must use tensor solver.\n");
    }

    // Check if scalars are diffusive type:
    // all the nComp scalars must be of the same type
    int diffType = a_is_diffusive[0];
    for (int comp = 1; comp < nComp; comp++) {
        if (a_is_diffusive[comp] != diffType) {
            amrex::Abort("All the scalars must be either diffusive or non-diffusive when calling diffuse_scalar");
        }
    }

    // If all non-diffusive, set flux to zero and exit
    if (diffType == 0) {
        for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
        {
            if (fluxn[idim]!= 0 && fluxnp1[idim]!= 0)
            {
                fluxn[idim]->setVal(0.0,fluxComp,nComp);
                fluxnp1[idim]->setVal(0.0,fluxComp,nComp);
            }
        }
        return;
    }

    bool has_coarse_data = S_new.size() > 1;

    const Real strt_time = ParallelDescriptor::second();

    int allthere, allnull;
    checkBeta(betan, allthere, allnull);
    checkBeta(betanp1, allthere);
    if (allnull && add_old_time_divFlux && be_cn_theta!=1)
       amrex::Abort("Diffusion::diffuse_scalar: Constant diffusivity case no longer supported separately. Must set non-zero beta.");

    //
    // No ghost cells are needed for MLMG in most cases. Except for
    // for cell-centered solver, you need to call setLevelBC, and that
    // needs to have 1 ghost cell if there is Dirichlet BC.
    //
    const int ng = 1;

    Real dt = curr_time - prev_time;
    AMREX_ASSERT(S_new[0]->nGrow()>0);
    if (S_old.size()>0) AMREX_ASSERT(S_old[0]->nGrow()>0);
    const BoxArray& ba = S_new[0]->boxArray();
    const DistributionMapping& dm = S_new[0]->DistributionMap();
    const DistributionMapping* dmc = (has_coarse_data ? &(S_new[1]->DistributionMap()) : 0);
    const BoxArray* bac = (has_coarse_data ? &(S_new[1]->boxArray()) : 0);

    const auto& factory = S_new[0]->Factory();

    MultiFab Rhs(ba,dm,nComp,0,MFInfo(),factory);
    MultiFab Soln(ba,dm,nComp,ng,MFInfo(),factory);

    auto Solnc = std::unique_ptr<MultiFab>(new MultiFab());
    if (has_coarse_data)
    {
      Solnc->define(*bac, *dmc, nComp, 0, MFInfo(), S_new[1]->Factory());
    }

    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;

    //
    // Create operator at time n and n+1
    //
    LPInfo infon;
    infon.setAgglomeration(agglomeration);
    infon.setConsolidation(consolidation);
    infon.setMaxCoarseningLevel(0);

#ifdef AMREX_USE_EB
    const auto& ebf = &(dynamic_cast<EBFArrayBoxFactory const&>(factory));
    MLEBABecLap opn({geom}, {ba}, {dm}, infon, {ebf}, nComp);
#else
    MLABecLaplacian opn({geom}, {ba}, {dm}, infon, {}, nComp);
#endif

    opn.setMaxOrder(max_order);
    MLMG mgn(opn);
    mgn.setVerbose(verbose);

    LPInfo infonp1;
    infonp1.setAgglomeration(agglomeration);
    infonp1.setConsolidation(consolidation);

#ifdef AMREX_USE_EB
    MLEBABecLap opnp1({geom}, {ba}, {dm}, infonp1, {ebf}, nComp);
#else
    MLABecLaplacian opnp1({geom}, {ba}, {dm}, infonp1, {}, nComp);
#endif
    opnp1.setMaxOrder(max_order);

    MLMG mgnp1(opnp1);
    if (use_hypre)
    {
      mgnp1.setBottomSolver(MLMG::BottomSolver::hypre);
      mgnp1.setBottomVerbose(hypre_verbose);
    }
    mgnp1.setMaxFmgIter(max_fmg_iter);
    mgnp1.setVerbose(verbose);

    setDomainBC(mlmg_lobc, mlmg_hibc, bc); // Same for all comps, by assumption
    opn.setDomainBC(mlmg_lobc, mlmg_hibc);
    opnp1.setDomainBC(mlmg_lobc, mlmg_hibc);

    if (verbose)
    {
       amrex::Print() << "diffusing of " << nComp << " scalars \n"
                      << "rho flag "<< rho_flag << "\n";
    }

    int sigma = S_comp;

    if (add_old_time_divFlux && be_cn_theta!=1) {
        Real a = 0.0;
        Real b = -(1.0-be_cn_theta)*dt;

        if(verbose)
             Print()<<"Adding old time diff ...\n";

        {
            if (has_coarse_data) {
                MultiFab::Copy(*Solnc,*S_old[1],sigma,0,nComp,0);
                if (rho_flag == 2) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                    for (MFIter mfi(*Solnc, TilingIfNotGPU()); mfi.isValid(); ++mfi)
                    {
                        const Box& bx = mfi.tilebox();
                        auto const& sol_arr = Solnc->array(mfi);
                        auto const& rho_arr = Rho_old[1]->const_array(mfi,Rho_comp);
                        amrex::ParallelFor(bx, [sol_arr, rho_arr, nComp]
                        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
                        {
                            Real rhoInv = 1.0 / rho_arr(i,j,k);
                            for (int n = 0; n < nComp; ++n) {
                               sol_arr(i,j,k,n) *= rhoInv;
                            }
                        });
                    }
                }
                opn.setCoarseFineBC(Solnc.get(), cratio[0]);
            }
            MultiFab::Copy(Soln,*S_old[0],sigma,0,nComp,ng);
            if (rho_flag == 2) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(Soln, TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.growntilebox(ng);
                    auto const& sol_arr = Soln.array(mfi);
                    auto const& rho_arr = Rho_old[0]->const_array(mfi,Rho_comp);
                    amrex::ParallelFor(bx, [sol_arr, rho_arr, nComp]
                    AMREX_GPU_DEVICE(int i, int j, int k) noexcept
                    {
                        Real rhoInv = 1.0 / rho_arr(i,j,k);
                        for (int n = 0; n < nComp; ++n) {
                           sol_arr(i,j,k,n) *= rhoInv;
                        }
                    });
                }
            }
            opn.setLevelBC(0, &Soln);
        }

        opn.setScalars(a,b);
        setBeta(opn,betan,betaComp,nComp);

#ifdef AMREX_USE_EB
        MultiFab rhs_tmp(ba,dm,nComp,2,MFInfo(),factory);
        rhs_tmp.setVal(0.);
        mgn.apply({&rhs_tmp},{&Soln});

        const amrex::MultiFab* weights;
        weights = &(ebf->getVolFrac());

        amrex::single_level_weighted_redistribute(rhs_tmp, Rhs, *weights, 0, nComp, geom);
#else
        mgn.apply({&Rhs},{&Soln});
#endif
        computeExtensiveFluxes(mgn, Soln, fluxn, fluxComp, nComp,
			       navier_stokes->area, -b/dt);
    } else {
        for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
        {
          fluxn[idim]->setVal(0.0,fluxComp,nComp);
        }
        Rhs.setVal(0.0);
    }

    // Get local version of the switch
    int has_alpha     = (alpha_in  != 0) ? 1 : 0;
    int has_delta_rhs = (delta_rhs != 0) ? 1 : 0;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*S_new[0], TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto const& rhs      = Rhs.array(mfi);
        auto const& solution = Soln.array(mfi);
        auto const& snew     = S_new[0]->array(mfi,sigma);
        Array4<const Real> dummy;
        auto const& rhoHalf  = (rho_flag == 1) ? rho_half.const_array(mfi) : dummy;
        auto const& rho_old  = (rho_flag == 3) ? Rho_old[0]->const_array(mfi,Rho_comp) : dummy;
        auto const& alpha    = (has_alpha) ? alpha_in->const_array(mfi,alpha_in_comp) : Soln.const_array(mfi);
        auto const& deltarhs = (has_delta_rhs) ? delta_rhs->const_array(mfi,rhsComp) : Soln.const_array(mfi);
        amrex::ParallelFor(bx, nComp, [rhs, solution, snew, rhoHalf, rho_old, alpha, deltarhs,
                                has_alpha, has_delta_rhs, rho_flag, dt ]
        AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
        {
            // Add body sources
            if ( has_delta_rhs ) {
                rhs(i,j,k,n) += deltarhs(i,j,k,n) * dt;
                if ( rho_flag == 1 ) {
                    rhs(i,j,k,n) *= rhoHalf(i,j,k);
                }
            }
            // Always do : copy S_new into Soln
            //             add Soln to Rhs
            solution(i,j,k,n) = snew(i,j,k,n);
            if ( rho_flag == 1) {
                solution(i,j,k,n) *= rhoHalf(i,j,k);
            } else if ( rho_flag == 3 ) {
                solution(i,j,k,n) *= rho_old(i,j,k);
            }
            if ( has_alpha ) {
                solution(i,j,k,n) *= alpha(i,j,k);
            }
            rhs(i,j,k,n) += solution(i,j,k,n);
        });
    }

    //
    // Set C&F solutions, levelBCs and CoarseFineBCs
    //
    if (has_coarse_data) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*Solnc, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            auto const& sol_arr  = Solnc->array(mfi);
            auto const& snew_arr = S_new[1]->const_array(mfi,sigma);
            auto const& rho_arr  = Rho_new[1]->const_array(mfi,Rho_comp);
            amrex::ParallelFor(bx, [sol_arr, snew_arr, rho_arr, nComp, rho_flag]
            AMREX_GPU_DEVICE(int i, int j, int k) noexcept
            {
                for (int n = 0; n < nComp; ++n) {
                   sol_arr(i,j,k,n) = snew_arr(i,j,k,n);
                }
                if (rho_flag == 2) {
                    Real rhoInv = 1.0 / rho_arr(i,j,k);
                    for (int n = 0; n < nComp; ++n) {
                       sol_arr(i,j,k,n) *= rhoInv;
                    }
                }
            });
        }
        opnp1.setCoarseFineBC(Solnc.get(), cratio[0]);
    }
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Soln, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(ng);
        auto const& sol_arr  = Soln.array(mfi);
        auto const& snew_arr = S_new[0]->const_array(mfi,sigma);
        auto const& rho_arr  = Rho_new[0]->const_array(mfi,Rho_comp);
        amrex::ParallelFor(bx, [sol_arr, snew_arr, rho_arr, nComp, rho_flag]
        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
        {
            for (int n = 0; n < nComp; ++n) {
               sol_arr(i,j,k,n) = snew_arr(i,j,k,n);
            }
            if (rho_flag == 2) {
                Real rhoInv = 1.0 / rho_arr(i,j,k);
                for (int n = 0; n < nComp; ++n) {
                   sol_arr(i,j,k,n) *= rhoInv;
                }
            }
        });
    }
    opnp1.setLevelBC(0, &Soln);

    Real a = 1.0;
    Real b = be_cn_theta*dt;
    Real rhsscale = 1.0;
    {
        std::pair<Real,Real> scalars;
        MultiFab alpha;
        const MultiFab* rho = (rho_flag == 1) ? &rho_half : Rho_new[0];
        int rhoComp = (rho_flag == 1 ) ? 0 : Rho_comp;

        computeAlpha(alpha, scalars, a, b,
                     &rhsscale, alpha_in, alpha_in_comp,
                     rho_flag, rho, rhoComp);
        opnp1.setScalars(scalars.first, scalars.second);
        opnp1.setACoeffs(0, alpha);
    }

    setBeta(opnp1,betanp1,betaComp,nComp);

    Rhs.mult(rhsscale,0,nComp);
    const Real S_tol     = visc_tol;
    const Real S_tol_abs = get_scaled_abs_tol(Rhs, visc_tol);

    mgnp1.solve({&Soln}, {&Rhs}, S_tol, S_tol_abs);

    computeExtensiveFluxes(mgnp1, Soln, fluxnp1, fluxComp, nComp,
			   navier_stokes->area, b/dt);

    //
    // Copy into state variable at new time, without bc's and * rho if needed
    //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*S_new[0], TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const Box& bx = mfi.tilebox();
       const auto& snew     = S_new[0]->array(mfi, sigma);
       const auto& solution = Soln.const_array(mfi);
       const auto& rhonew   = (rho_flag == 2) ? Rho_new[0]->const_array(mfi,Rho_comp) : S_new[0]->const_array(mfi,sigma);
       amrex::ParallelFor(bx, nComp, [snew, solution, rhonew, rho_flag]
       AMREX_GPU_DEVICE(int i, int j, int k, int n) noexcept
       {
          snew(i,j,k,n) = solution(i,j,k,n);
          if (rho_flag == 2) {
             snew(i,j,k,n) *= rhonew(i,j,k);
          }
       });
    }

    if (verbose) {
       const int IOProc   = ParallelDescriptor::IOProcessorNumber();
       Real      run_time = ParallelDescriptor::second() - strt_time;
       ParallelDescriptor::ReduceRealMax(run_time,IOProc);
       amrex::Print() << "Diffusion::diffuse_scalar() time: " << run_time << '\n';
    }
}